

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

int Cudd_BddToCubeArray(DdManager *dd,DdNode *cube,int *array)

{
  int iVar1;
  ulong uVar2;
  DdNode *pDVar3;
  int index;
  DdNode *zero;
  int size;
  int i;
  DdNode *e;
  DdNode *t;
  DdNode *scan;
  int *array_local;
  DdNode *cube_local;
  DdManager *dd_local;
  
  scan = (DdNode *)array;
  array_local = (int *)cube;
  cube_local = &dd->sentinel;
  zero._4_4_ = Cudd_ReadSize(dd);
  uVar2._0_4_ = cube_local[1].index;
  uVar2._4_4_ = cube_local[1].ref;
  pDVar3 = (DdNode *)(uVar2 ^ 1);
  while (zero._4_4_ = zero._4_4_ + -1, -1 < zero._4_4_) {
    (&scan->index)[zero._4_4_] = 2;
  }
  t = (DdNode *)array_local;
  while( true ) {
    while( true ) {
      if (*(int *)((ulong)t & 0xfffffffffffffffe) == 0x7fffffff) {
        dd_local._4_4_ = (uint)(t != pDVar3);
        return dd_local._4_4_;
      }
      iVar1 = *(int *)((ulong)t & 0xfffffffffffffffe);
      cuddGetBranches(t,&e,(DdNode **)&size);
      if (e != pDVar3) break;
      (&scan->index)[iVar1] = 0;
      t = _size;
    }
    if (_size != pDVar3) break;
    (&scan->index)[iVar1] = 1;
    t = e;
  }
  return 0;
}

Assistant:

int
Cudd_BddToCubeArray(
  DdManager *dd,
  DdNode *cube,
  int *array)
{
    DdNode *scan, *t, *e;
    int i;
    int size = Cudd_ReadSize(dd);
    DdNode *zero = Cudd_Not(DD_ONE(dd));

    for (i = size-1; i >= 0; i--) {
        array[i] = 2;
    }
    scan = cube;
    while (!Cudd_IsConstant(scan)) {
        int index = Cudd_Regular(scan)->index;
        cuddGetBranches(scan,&t,&e);
        if (t == zero) {
            array[index] = 0;
            scan = e;
        } else if (e == zero) {
            array[index] = 1;
            scan = t;
        } else {
            return(0);  /* cube is not a cube */
        }
    }
    if (scan == zero) {
        return(0);
    } else {
        return(1);
    }

}